

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O1

LPVOID VIRTUALReserveMemory
                 (CPalThread *pthrCurrent,LPVOID lpAddress,SIZE_T dwSize,DWORD flAllocationType,
                 DWORD flProtect)

{
  bool bVar1;
  byte bVar2;
  undefined1 *__addr;
  int *piVar3;
  PCMI pInformation;
  BYTE *pBVar4;
  PCMI p_Var5;
  _CMI *p_Var6;
  PCMI p_Var7;
  size_t szSize;
  undefined1 *__addr_00;
  ulong __len;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_001d2723;
  if ((flAllocationType >> 0x1e & 1) != 0) {
    fprintf(_stderr,"MEM_RESERVE_EXECUTABLE is not supported!");
    abort();
  }
  CorUnix::InternalEnterCriticalSection(pthrCurrent,&virtual_critsec);
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d2723;
  __addr_00 = (undefined1 *)((ulong)lpAddress & 0xffffffffffff0000);
  __len = ((long)lpAddress + dwSize + 0xfff & 0xfffffffffffff000) - (long)__addr_00;
  __addr = (undefined1 *)mmap64(__addr_00,__len,0,0x22,-1,0);
  if (((__addr == &DAT_ffffffffffffffff) || (__addr_00 == (undefined1 *)0x0)) ||
     (__addr == __addr_00)) {
    if (__addr == &DAT_ffffffffffffffff) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d2723;
      piVar3 = __errno_location();
      *piVar3 = 8;
      goto LAB_001d24bc;
    }
  }
  else {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d2723;
    piVar3 = __errno_location();
    *piVar3 = 0x1e7;
    munmap(__addr,__len);
LAB_001d24bc:
    __addr = (undefined1 *)0x0;
  }
  if (__addr != (undefined1 *)0x0) {
    if (lpAddress == (LPVOID)0x0) {
      __addr_00 = (undefined1 *)((ulong)__addr & 0xfffffffffffff000);
      __len = ((ulong)(__addr + dwSize + 0xfff) & 0xfffffffffffff000) - (long)__addr_00;
    }
    pInformation = (PCMI)CorUnix::InternalMalloc(0x38);
    if (pInformation == (PCMI)0x0) {
      bVar1 = true;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d2723;
    }
    else {
      pInformation->startBoundary = (UINT_PTR)__addr_00;
      pInformation->memSize = __len;
      pInformation->allocationType = flAllocationType;
      pInformation->accessProtection = flProtect;
      szSize = ((__len >> 0xf) + 1) - (ulong)((__len & 0x7000) == 0);
      pBVar4 = (BYTE *)CorUnix::InternalMalloc(szSize);
      pInformation->pAllocState = pBVar4;
      pBVar4 = (BYTE *)CorUnix::InternalMalloc(__len >> 0xc);
      pInformation->pProtectionState = pBVar4;
      if ((pBVar4 == (BYTE *)0x0) || (pInformation->pAllocState == (BYTE *)0x0)) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d2723;
        if (pBVar4 != (BYTE *)0x0) {
          CorUnix::InternalFree(pBVar4);
        }
        pInformation->pProtectionState = (BYTE *)0x0;
        if (pInformation->pAllocState != (BYTE *)0x0) {
          CorUnix::InternalFree(pInformation->pAllocState);
        }
        pInformation->pAllocState = (BYTE *)0x0;
        CorUnix::InternalFree(pInformation);
        bVar1 = true;
      }
      else {
        VIRTUALSetAllocState(0x2000,0,szSize * 8,pInformation);
        pBVar4 = pInformation->pProtectionState;
        bVar2 = VIRTUALConvertWinFlags(flProtect);
        memset(pBVar4,(uint)bVar2,__len >> 0xc);
        if ((pVirtualMemory == (PCMI)0x0) ||
           (__addr_00 <= (undefined1 *)pVirtualMemory->startBoundary)) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d2723;
          pInformation->pNext = pVirtualMemory;
          pInformation->pLast = (_CMI *)0x0;
          if (pVirtualMemory != (PCMI)0x0) {
            pVirtualMemory->pLast = pInformation;
          }
          bVar1 = false;
          pVirtualMemory = pInformation;
        }
        else {
          p_Var6 = pVirtualMemory;
          if (PAL_InitializeChakraCoreCalled != true) goto LAB_001d2723;
          do {
            p_Var5 = p_Var6;
            p_Var6 = p_Var5->pNext;
            if (p_Var6 == (_CMI *)0x0) {
              pInformation->pNext = (_CMI *)0x0;
              p_Var6 = pInformation;
              p_Var7 = p_Var5;
              goto LAB_001d270e;
            }
          } while ((undefined1 *)p_Var6->startBoundary < __addr_00);
          pInformation->pNext = p_Var6;
          pInformation->pLast = p_Var5;
          p_Var7 = pInformation;
LAB_001d270e:
          p_Var6->pLast = p_Var7;
          p_Var5->pNext = pInformation;
          bVar1 = false;
        }
      }
    }
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_001d2723:
      abort();
    }
    if (!bVar1) goto LAB_001d256d;
    fprintf(_stderr,"] %s %s:%d","VIRTUALReserveMemory",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x401);
    fprintf(_stderr,"Unable to store the structure in the list.\n");
    piVar3 = __errno_location();
    *piVar3 = 0x54f;
    munmap(__addr,__len);
  }
  __addr = (undefined1 *)0x0;
LAB_001d256d:
  CorUnix::InternalLeaveCriticalSection(pthrCurrent,&virtual_critsec);
  return __addr;
}

Assistant:

static LPVOID VIRTUALReserveMemory(
                IN CPalThread *pthrCurrent, /* Currently executing thread */
                IN LPVOID lpAddress,        /* Region to reserve or commit */
                IN SIZE_T dwSize,           /* Size of Region */
                IN DWORD flAllocationType,  /* Type of allocation */
                IN DWORD flProtect)         /* Type of access protection */
{
    LPVOID pRetVal      = NULL;
    UINT_PTR StartBoundary;
    SIZE_T MemSize;

    TRACE( "Reserving the memory now..\n");

    // First, figure out where we're trying to reserve the memory and
    // how much we need. On most systems, requests to mmap must be
    // page-aligned and at multiples of the page size.
    StartBoundary = (UINT_PTR)lpAddress & ~BOUNDARY_64K;
    /* Add the sizes, and round down to the nearest page boundary. */
    MemSize = ( ((UINT_PTR)lpAddress + dwSize + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK ) -
               StartBoundary;

    if ((flAllocationType & MEM_RESERVE_EXECUTABLE) != 0)
    {
        fprintf(stderr, "MEM_RESERVE_EXECUTABLE is not supported!");
        abort();
    }

    InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);

    if (pRetVal == NULL)
    {
        // Try to reserve memory from the OS
        pRetVal = ReserveVirtualMemory(pthrCurrent, (LPVOID)StartBoundary, MemSize);
    }

    if (pRetVal != NULL)
    {
#if !MMAP_IGNORES_HINT
        if ( !lpAddress )
        {
#endif  // MMAP_IGNORES_HINT
            /* Compute the real values instead of the null values. */
            StartBoundary = (UINT_PTR)pRetVal & ~VIRTUAL_PAGE_MASK;

            MemSize = ( ((UINT_PTR)pRetVal + dwSize + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK ) -
                      StartBoundary;
#if !MMAP_IGNORES_HINT
        }
#endif  // MMAP_IGNORES_HINT
        if ( !VIRTUALStoreAllocationInfo( StartBoundary, MemSize,
                                   flAllocationType, flProtect ) )
        {
            ASSERT( "Unable to store the structure in the list.\n");
            pthrCurrent->SetLastError( ERROR_INTERNAL_ERROR );
            munmap( pRetVal, MemSize );
            pRetVal = NULL;
        }
    }

    InternalLeaveCriticalSection(pthrCurrent, &virtual_critsec);
    return pRetVal;
}